

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O2

vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> * __thiscall
ram::MinimizerEngine::Minimize
          (vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
           *__return_storage_ptr__,MinimizerEngine *this,
          unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *sequence,
          bool minhash)

{
  byte *pbVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint32_t i;
  uint i_00;
  NucleicAcid *this_00;
  ulong key;
  _Elt_pointer pKVar8;
  _Elt_pointer __args;
  ulong key_00;
  _Map_pointer local_c0;
  anon_class_8_1_898eb3ea hash;
  ulong local_98;
  anon_class_8_1_722fcd2e window_add;
  uint64_t mask;
  deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> window;
  
  if (((sequence->_M_t).
       super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>._M_t.
       super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>.
       super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->inflated_len < this->k_)
  {
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    mask = ~(-1L << ((char)this->k_ * '\x02' & 0x3fU));
    hash.mask = &mask;
    std::_Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
    _Deque_base(&window.
                 super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
               );
    uVar2 = this->k_;
    this_00 = (sequence->_M_t).
              super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
              ._M_t.
              super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
              .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl;
    uVar3 = this_00->id;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    key_00 = 0;
    key = 0;
    window_add.window =
         (deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *)
         &window.
          super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
    ;
    for (i_00 = 0; i_00 < this_00->inflated_len; i_00 = i_00 + 1) {
      uVar6 = biosoup::NucleicAcid::Code(this_00,i_00);
      key = (key << 2 | uVar6) & mask;
      key_00 = (uVar6 ^ 3) << ((char)uVar2 * '\x02' - 2U & 0x3f) | key_00 >> 2;
      uVar4 = this->k_;
      if (uVar4 - 1 <= i_00) {
        if (key < key_00) {
          uVar6 = Minimize::anon_class_8_1_898eb3ea::operator()(&hash,key);
          uVar7 = (i_00 - uVar4) * 2 + 2;
        }
        else {
          if (key <= key_00) goto LAB_00110c75;
          uVar6 = Minimize::anon_class_8_1_898eb3ea::operator()(&hash,key_00);
          uVar7 = (i_00 - uVar4) * 2 + 3;
        }
        Minimize::anon_class_8_1_722fcd2e::operator()(&window_add,uVar6,(ulong)uVar7);
      }
LAB_00110c75:
      if ((this->k_ + this->w_) - 2 <= i_00) {
        local_c0 = window.
                   super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        pKVar8 = window.
                 super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
        __args = window.
                 super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        while ((__args != window.
                          super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur &&
               (__args->value ==
                (window.
                 super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->value))) {
          if (-1 < (long)__args->origin) {
            local_98 = __args->origin | (ulong)uVar3 << 0x20;
            std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>::
            emplace_back<unsigned_long&,unsigned_long>
                      ((vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>
                        *)__return_storage_ptr__,&__args->value,&local_98);
            pbVar1 = (byte *)((long)&__args->origin + 7);
            *pbVar1 = *pbVar1 | 0x80;
          }
          __args = __args + 1;
          if (__args == pKVar8) {
            __args = local_c0[1];
            local_c0 = local_c0 + 1;
            pKVar8 = __args + 0x20;
          }
        }
        uVar4 = this->k_;
        uVar5 = this->w_;
        while ((window.
                super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                window.
                super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur &&
               ((uint)(window.
                       super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur)->origin >> 1 <
                (i_00 - (uVar4 + uVar5)) + 3))) {
          std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
          pop_front(&window);
        }
      }
      this_00 = (sequence->_M_t).
                super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                ._M_t.
                super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl;
    }
    if (minhash) {
      RadixSort<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Kmer*,std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>>,unsigned_long(*)(ram::MinimizerEngine::Kmer_const&)>
                ((__return_storage_ptr__->
                 super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->
                 super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                 )._M_impl.super__Vector_impl_data._M_finish,(char)this->k_ * '\x02',
                 Kmer::SortByValue);
      std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::resize
                (__return_storage_ptr__,
                 (ulong)((sequence->_M_t).
                         super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                         .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->
                        inflated_len / (ulong)this->k_);
      RadixSort<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Kmer*,std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>>,unsigned_long(*)(ram::MinimizerEngine::Kmer_const&)>
                ((__return_storage_ptr__->
                 super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->
                 super__Vector_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                 )._M_impl.super__Vector_impl_data._M_finish,'@',Kmer::SortByOrigin);
    }
    std::_Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
    ~_Deque_base(&window.
                  super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MinimizerEngine::Kmer> MinimizerEngine::Minimize(
    const std::unique_ptr<biosoup::NucleicAcid>& sequence,
    bool minhash) const {
  if (sequence->inflated_len < k_) {
    return std::vector<Kmer>{};
  }

  std::uint64_t mask = (1ULL << (k_ * 2)) - 1;

  auto hash = [&] (std::uint64_t key) -> std::uint64_t {
    key = ((~key) + (key << 21)) & mask;
    key = key ^ (key >> 24);
    key = ((key + (key << 3)) + (key << 8)) & mask;
    key = key ^ (key >> 14);
    key = ((key + (key << 2)) + (key << 4)) & mask;
    key = key ^ (key >> 28);
    key = (key + (key << 31)) & mask;
    return key;
  };

  std::deque<Kmer> window;
  auto window_add = [&] (std::uint64_t value, std::uint64_t location) -> void {
    while (!window.empty() && window.back().value > value) {
      window.pop_back();
    }
    window.emplace_back(value, location);
  };
  auto window_update = [&] (std::uint32_t position) -> void {
    while (!window.empty() && (window.front().position()) < position) {
      window.pop_front();
    }
  };

  std::uint64_t shift = (k_ - 1) * 2;
  std::uint64_t minimizer = 0;
  std::uint64_t reverse_minimizer = 0;
  std::uint64_t id = static_cast<std::uint64_t>(sequence->id) << 32;
  std::uint64_t is_stored = 1ULL << 63;

  std::vector<Kmer> dst;

  for (std::uint32_t i = 0; i < sequence->inflated_len; ++i) {
    std::uint64_t c = sequence->Code(i);
    minimizer = ((minimizer << 2) | c) & mask;
    reverse_minimizer = (reverse_minimizer >> 2) | ((c ^ 3) << shift);
    if (i >= k_ - 1U) {
      if (minimizer < reverse_minimizer) {
        window_add(hash(minimizer), (i - (k_ - 1U)) << 1 | 0);
      } else if (minimizer > reverse_minimizer) {
        window_add(hash(reverse_minimizer), (i - (k_ - 1U)) << 1 | 1);
      }
    }
    if (i >= (k_ - 1U) + (w_ - 1U)) {
      for (auto it = window.begin(); it != window.end(); ++it) {
        if (it->value != window.front().value) {
          break;
        }
        if (it->origin & is_stored) {
          continue;
        }
        dst.emplace_back(it->value, id | it->origin);
        it->origin |= is_stored;
      }
      window_update(i - (k_ - 1U) - (w_ - 1U) + 1);
    }
  }

  if (minhash) {
    RadixSort(dst.begin(), dst.end(), k_ * 2, Kmer::SortByValue);
    dst.resize(sequence->inflated_len / k_);
    RadixSort(dst.begin(), dst.end(), 64, Kmer::SortByOrigin);
  }

  return dst;
}